

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool leveldb::SomeFileOverlapsRange
               (InternalKeyComparator *icmp,bool disjoint_sorted_files,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               Slice *smallest_user_key,Slice *largest_user_key)

{
  Comparator *ucmp;
  FileMetaData *f;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer ppFVar5;
  ulong uVar6;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  InternalKey small_key;
  Slice local_68;
  Slice local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ucmp = icmp->user_comparator_;
  if ((int)CONCAT71(in_register_00000031,disjoint_sorted_files) == 0) {
    ppFVar5 = (files->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = (files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_finish != ppFVar5;
    if (bVar2) {
      uVar6 = 0;
      do {
        f = ppFVar5[uVar6];
        if (smallest_user_key == (Slice *)0x0) {
LAB_00d3d389:
          bVar1 = BeforeFile(ucmp,largest_user_key,f);
          if (!bVar1) break;
        }
        else {
          local_58 = InternalKey::user_key(&f->largest);
          iVar4 = (*ucmp->_vptr_Comparator[2])(ucmp,smallest_user_key,&local_58);
          if (iVar4 < 1) goto LAB_00d3d389;
        }
        uVar6 = uVar6 + 1;
        ppFVar5 = (files->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar6 < (ulong)((long)(files->
                                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >>
                               3);
      } while (bVar2);
    }
  }
  else {
    if (smallest_user_key == (Slice *)0x0) {
      uVar6 = 0;
    }
    else {
      InternalKey::InternalKey
                ((InternalKey *)&local_58,smallest_user_key,0xffffffffffffff,kTypeValue);
      if (local_58.size_ == 0) {
        __assert_fail("!rep_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                      ,0x96,"Slice leveldb::InternalKey::Encode() const");
      }
      local_68.data_ = local_58.data_;
      local_68.size_ = local_58.size_;
      uVar3 = FindFile(icmp,files,&local_68);
      uVar6 = (ulong)uVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.data_ != &local_48) {
        operator_delete(local_58.data_,local_48._M_allocated_capacity + 1);
      }
    }
    ppFVar5 = (files->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)((long)(files->
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3)) {
      bVar2 = BeforeFile(ucmp,largest_user_key,ppFVar5[uVar6]);
      bVar2 = !bVar2;
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool SomeFileOverlapsRange(const InternalKeyComparator& icmp,
                           bool disjoint_sorted_files,
                           const std::vector<FileMetaData*>& files,
                           const Slice* smallest_user_key,
                           const Slice* largest_user_key) {
  const Comparator* ucmp = icmp.user_comparator();
  if (!disjoint_sorted_files) {
    // Need to check against all files
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      if (AfterFile(ucmp, smallest_user_key, f) ||
          BeforeFile(ucmp, largest_user_key, f)) {
        // No overlap
      } else {
        return true;  // Overlap
      }
    }
    return false;
  }

  // Binary search over file list
  uint32_t index = 0;
  if (smallest_user_key != nullptr) {
    // Find the earliest possible internal key for smallest_user_key
    InternalKey small_key(*smallest_user_key, kMaxSequenceNumber,
                          kValueTypeForSeek);
    index = FindFile(icmp, files, small_key.Encode());
  }

  if (index >= files.size()) {
    // beginning of range is after all files, so no overlap.
    return false;
  }

  return !BeforeFile(ucmp, largest_user_key, files[index]);
}